

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall
pugi::impl::anon_unknown_0::xml_parser::parse_tree
          (xml_parser *this,char_t *s,xml_node_struct *root,uint optmsk,char_t endch)

{
  char cVar1;
  uintptr_t *puVar2;
  xml_node_struct *pxVar3;
  xml_attribute_struct *pxVar4;
  xml_node_struct *pxVar5;
  bool bVar6;
  char *local_78;
  char_t *name;
  char_t ss_1;
  xml_attribute_struct *a;
  char_t ss;
  char_t *mark;
  xml_node_struct *cursor;
  strconv_pcdata_t p_Stack_40;
  char_t ch;
  strconv_pcdata_t strconv_pcdata;
  strconv_attribute_t strconv_attribute;
  char_t endch_local;
  xml_node_struct *pxStack_28;
  uint optmsk_local;
  xml_node_struct *root_local;
  char_t *s_local;
  xml_parser *this_local;
  
  strconv_attribute._3_1_ = endch;
  strconv_attribute._4_4_ = optmsk;
  pxStack_28 = root;
  root_local = (xml_node_struct *)s;
  s_local = (char_t *)this;
  strconv_pcdata = (strconv_pcdata_t)get_strconv_attribute(optmsk);
  p_Stack_40 = get_strconv_pcdata(strconv_attribute._4_4_);
  cursor._7_1_ = 0;
  mark = (char_t *)pxStack_28;
  pxVar5 = root_local;
LAB_00502814:
  root_local = pxVar5;
  pxVar3 = root_local;
  if ((char)root_local->header == '\0') goto LAB_005033ea;
  if ((char)root_local->header == '<') {
    root_local = (xml_node_struct *)((long)&root_local->header + 1);
  }
  else {
    while (((anonymous_namespace)::chartype_table[(byte)root_local->header] & 8) != 0) {
      root_local = (xml_node_struct *)((long)&root_local->header + 1);
    }
    if (((char)root_local->header == '<') || ((char)root_local->header == '\0')) {
      if (pxVar3 == root_local) {
        __assert_fail("mark != s",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0xd83,
                      "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                     );
      }
      pxVar5 = root_local;
      if ((((strconv_attribute._4_4_ & 0x408) == 0) || ((strconv_attribute._4_4_ & 0x800) != 0)) ||
         (((strconv_attribute._4_4_ & 0x400) != 0 &&
          ((((char)root_local->header != '<' || (*(char *)((long)&root_local->header + 1) != '/'))
           || (*(long *)(mark + 0x20) != 0)))))) goto LAB_00502814;
    }
    if ((strconv_attribute._4_4_ & 0x800) == 0) {
      root_local = pxVar3;
    }
    if ((*(long *)(mark + 0x18) == 0) && ((strconv_attribute._4_4_ & 0x1000) == 0)) {
      while( true ) {
        bVar6 = false;
        if ((char)root_local->header != '\0') {
          bVar6 = (char)root_local->header != '<';
        }
        if (!bVar6) break;
        root_local = (xml_node_struct *)((long)&root_local->header + 1);
      }
      if ((char)root_local->header == '\0') {
LAB_005033ea:
        if ((xml_node_struct *)mark != pxStack_28) {
          this->error_offset = (char_t *)root_local;
          this->error_status = status_end_element_mismatch;
          return (char_t *)0x0;
        }
        return (char_t *)root_local;
      }
      root_local = (xml_node_struct *)((long)&root_local->header + 1);
    }
    else {
      if ((((strconv_attribute._4_4_ & 0x2000) == 0) ||
          ((*(long *)(mark + 0x18) == 0 || (*(long *)(mark + 0x20) != 0)))) ||
         (*(long *)(mark + 0x10) != 0)) {
        pxVar5 = append_new_node((xml_node_struct *)mark,this->alloc,node_pcdata);
        if (pxVar5 == (xml_node_struct *)0x0) {
          this->error_offset = (char_t *)root_local;
          this->error_status = status_out_of_memory;
          return (char_t *)0x0;
        }
        pxVar5->value = (char_t *)root_local;
        mark = (char_t *)pxVar5->parent;
      }
      else {
        *(xml_node_struct **)(mark + 0x10) = root_local;
      }
      root_local = (xml_node_struct *)(*p_Stack_40)((char_t *)root_local);
      if ((char)root_local->header == '\0') goto LAB_005033ea;
    }
  }
  if (((anonymous_namespace)::chartype_table[(byte)root_local->header] & 0x80) == 0) {
    if ((char)root_local->header == '/') {
      pxVar5 = (xml_node_struct *)((long)&root_local->header + 1);
      local_78 = *(char **)(mark + 8);
      root_local = pxVar5;
      if (*(char **)(mark + 8) == (char *)0x0) {
        this->error_offset = (char_t *)pxVar5;
        this->error_status = status_end_element_mismatch;
        return (char_t *)0x0;
      }
      while (((anonymous_namespace)::chartype_table[(byte)root_local->header] & 0x40) != 0) {
        puVar2 = &root_local->header;
        cVar1 = *local_78;
        local_78 = local_78 + 1;
        root_local = (xml_node_struct *)((long)&root_local->header + 1);
        if ((char)*puVar2 != cVar1) {
          this->error_offset = (char_t *)pxVar5;
          this->error_status = status_end_element_mismatch;
          return (char_t *)0x0;
        }
      }
      if (*local_78 != '\0') {
        if ((((char)root_local->header == '\0') && (*local_78 == strconv_attribute._3_1_)) &&
           (local_78[1] == '\0')) {
          this->error_offset = (char_t *)root_local;
          this->error_status = status_bad_end_element;
        }
        else {
          this->error_offset = (char_t *)pxVar5;
          this->error_status = status_end_element_mismatch;
        }
        return (char_t *)0x0;
      }
      mark = *(char_t **)(mark + 0x18);
      while (((anonymous_namespace)::chartype_table[(byte)root_local->header] & 8) != 0) {
        root_local = (xml_node_struct *)((long)&root_local->header + 1);
      }
      if ((char)root_local->header == '\0') {
        pxVar5 = root_local;
        if (strconv_attribute._3_1_ != '>') {
          this->error_offset = (char_t *)root_local;
          this->error_status = status_bad_end_element;
          return (char_t *)0x0;
        }
      }
      else {
        if ((char)root_local->header != '>') {
          this->error_offset = (char_t *)root_local;
          this->error_status = status_bad_end_element;
          return (char_t *)0x0;
        }
        pxVar5 = (xml_node_struct *)((long)&root_local->header + 1);
      }
    }
    else if ((char)root_local->header == '?') {
      root_local = (xml_node_struct *)
                   parse_question(this,(char_t *)root_local,(xml_node_struct **)&mark,
                                  strconv_attribute._4_4_,strconv_attribute._3_1_);
      if (root_local == (xml_node_struct *)0x0) {
        return (char_t *)0x0;
      }
      if (mark == (char_t *)0x0) {
        __assert_fail("cursor",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0xd6f,
                      "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                     );
      }
      pxVar5 = root_local;
      if (((uint)*(undefined8 *)mark & 0xf) == 7) goto LAB_005029ed;
    }
    else {
      if ((char)root_local->header != '!') {
        if (((char)root_local->header == '\0') && (strconv_attribute._3_1_ == '?')) {
          this->error_offset = (char_t *)root_local;
          this->error_status = status_bad_pi;
          return (char_t *)0x0;
        }
        this->error_offset = (char_t *)root_local;
        this->error_status = status_unrecognized_tag;
        return (char_t *)0x0;
      }
      pxVar5 = (xml_node_struct *)
               parse_exclamation(this,(char_t *)root_local,(xml_node_struct *)mark,
                                 strconv_attribute._4_4_,strconv_attribute._3_1_);
      if (pxVar5 == (xml_node_struct *)0x0) {
        return (char_t *)0x0;
      }
    }
  }
  else {
    mark = (char_t *)append_new_node((xml_node_struct *)mark,this->alloc,node_element);
    if ((xml_node_struct *)mark == (xml_node_struct *)0x0) {
      this->error_offset = (char_t *)root_local;
      this->error_status = status_out_of_memory;
      return (char_t *)0x0;
    }
    ((xml_node_struct *)mark)->name = (char_t *)root_local;
    while (((anonymous_namespace)::chartype_table[(byte)root_local->header] & 0x40) != 0) {
      if (((anonymous_namespace)::chartype_table[*(byte *)((long)&root_local->header + 1)] & 0x40)
          == 0) {
        root_local = (xml_node_struct *)((long)&root_local->header + 1);
        break;
      }
      if (((anonymous_namespace)::chartype_table[*(byte *)((long)&root_local->header + 2)] & 0x40)
          == 0) {
        root_local = (xml_node_struct *)((long)&root_local->header + 2);
        break;
      }
      if (((anonymous_namespace)::chartype_table[*(byte *)((long)&root_local->header + 3)] & 0x40)
          == 0) {
        root_local = (xml_node_struct *)((long)&root_local->header + 3);
        break;
      }
      root_local = (xml_node_struct *)((long)&root_local->header + 4);
    }
    cursor._7_1_ = (byte)root_local->header;
    *(undefined1 *)&root_local->header = 0;
    pxVar5 = (xml_node_struct *)((long)&root_local->header + 1);
    if (cursor._7_1_ != 0x3e) {
      if (((anonymous_namespace)::chartype_table[cursor._7_1_] & 8) == 0) {
        if (cursor._7_1_ == 0x2f) {
          if (((char)pxVar5->header != '>') &&
             (((char)pxVar5->header != '\0' || (strconv_attribute._3_1_ != '>')))) {
            this->error_offset = (char_t *)pxVar5;
            this->error_status = status_bad_start_element;
            return (char_t *)0x0;
          }
          mark = (char_t *)((xml_node_struct *)mark)->parent;
          pxVar5 = (xml_node_struct *)
                   ((long)&pxVar5->header + (long)(int)(uint)((char)pxVar5->header == '>'));
        }
        else {
          if (cursor._7_1_ != 0) {
            this->error_offset = (char_t *)pxVar5;
            this->error_status = status_bad_start_element;
            return (char_t *)0x0;
          }
          pxVar5 = root_local;
          if (strconv_attribute._3_1_ != '>') {
            this->error_offset = (char_t *)root_local;
            this->error_status = status_bad_start_element;
            return (char_t *)0x0;
          }
        }
      }
      else {
LAB_005029ed:
        while( true ) {
          while (root_local = pxVar5,
                ((anonymous_namespace)::chartype_table[(byte)root_local->header] & 8) != 0) {
            pxVar5 = (xml_node_struct *)((long)&root_local->header + 1);
          }
          if (((anonymous_namespace)::chartype_table[(byte)root_local->header] & 0x80) == 0) break;
          pxVar4 = append_new_attribute((xml_node_struct *)mark,this->alloc);
          if (pxVar4 == (xml_attribute_struct *)0x0) {
            this->error_offset = (char_t *)root_local;
            this->error_status = status_out_of_memory;
            return (char_t *)0x0;
          }
          pxVar4->name = (char_t *)root_local;
          while (((anonymous_namespace)::chartype_table[(byte)root_local->header] & 0x40) != 0) {
            if (((anonymous_namespace)::chartype_table[*(byte *)((long)&root_local->header + 1)] &
                0x40) == 0) {
              root_local = (xml_node_struct *)((long)&root_local->header + 1);
              break;
            }
            if (((anonymous_namespace)::chartype_table[*(byte *)((long)&root_local->header + 2)] &
                0x40) == 0) {
              root_local = (xml_node_struct *)((long)&root_local->header + 2);
              break;
            }
            if (((anonymous_namespace)::chartype_table[*(byte *)((long)&root_local->header + 3)] &
                0x40) == 0) {
              root_local = (xml_node_struct *)((long)&root_local->header + 3);
              break;
            }
            root_local = (xml_node_struct *)((long)&root_local->header + 4);
          }
          cursor._7_1_ = (byte)root_local->header;
          *(undefined1 *)&root_local->header = 0;
          root_local = (xml_node_struct *)((long)&root_local->header + 1);
          if (((anonymous_namespace)::chartype_table[cursor._7_1_] & 8) != 0) {
            while (((anonymous_namespace)::chartype_table[(byte)root_local->header] & 8) != 0) {
              root_local = (xml_node_struct *)((long)&root_local->header + 1);
            }
            cursor._7_1_ = (byte)root_local->header;
            root_local = (xml_node_struct *)((long)&root_local->header + 1);
          }
          if (cursor._7_1_ != 0x3d) {
            this->error_offset = (char_t *)root_local;
            this->error_status = status_bad_attribute;
            return (char_t *)0x0;
          }
          while (((anonymous_namespace)::chartype_table[(byte)root_local->header] & 8) != 0) {
            root_local = (xml_node_struct *)((long)&root_local->header + 1);
          }
          if (((char)root_local->header != '\"') && ((char)root_local->header != '\'')) {
            this->error_offset = (char_t *)root_local;
            this->error_status = status_bad_attribute;
            return (char_t *)0x0;
          }
          cursor._7_1_ = (byte)root_local->header;
          root_local = (xml_node_struct *)((long)&root_local->header + 1);
          pxVar4->value = (char_t *)root_local;
          pxVar5 = (xml_node_struct *)(*strconv_pcdata)((char_t *)root_local);
          if (pxVar5 == (xml_node_struct *)0x0) {
            this->error_offset = pxVar4->value;
            this->error_status = status_bad_attribute;
            return (char_t *)0x0;
          }
          if (((anonymous_namespace)::chartype_table[(byte)pxVar5->header] & 0x80) != 0) {
            this->error_offset = (char_t *)pxVar5;
            this->error_status = status_bad_attribute;
            return (char_t *)0x0;
          }
        }
        if ((char)root_local->header == '/') {
          pxVar5 = (xml_node_struct *)((long)&root_local->header + 1);
          if ((char)pxVar5->header == '>') {
            mark = *(char_t **)(mark + 0x18);
            pxVar5 = (xml_node_struct *)((long)&root_local->header + 2);
          }
          else {
            if (((char)pxVar5->header != '\0') || (strconv_attribute._3_1_ != '>')) {
              this->error_offset = (char_t *)pxVar5;
              this->error_status = status_bad_start_element;
              return (char_t *)0x0;
            }
            mark = *(char_t **)(mark + 0x18);
          }
        }
        else if ((char)root_local->header == '>') {
          pxVar5 = (xml_node_struct *)((long)&root_local->header + 1);
        }
        else if (((char)root_local->header != '\0') ||
                (pxVar5 = root_local, strconv_attribute._3_1_ != '>')) {
          this->error_offset = (char_t *)root_local;
          this->error_status = status_bad_start_element;
          return (char_t *)0x0;
        }
      }
    }
  }
  goto LAB_00502814;
}

Assistant:

char_t* parse_tree(char_t* s, xml_node_struct* root, unsigned int optmsk, char_t endch)
		{
			strconv_attribute_t strconv_attribute = get_strconv_attribute(optmsk);
			strconv_pcdata_t strconv_pcdata = get_strconv_pcdata(optmsk);

			char_t ch = 0;
			xml_node_struct* cursor = root;
			char_t* mark = s;

			while (*s != 0)
			{
				if (*s == '<')
				{
					++s;

				LOC_TAG:
					if (PUGI_IMPL_IS_CHARTYPE(*s, ct_start_symbol)) // '<#...'
					{
						PUGI_IMPL_PUSHNODE(node_element); // Append a new node to the tree.

						cursor->name = s;

						PUGI_IMPL_SCANWHILE_UNROLL(PUGI_IMPL_IS_CHARTYPE(ss, ct_symbol)); // Scan for a terminator.
						PUGI_IMPL_ENDSEG(); // Save char in 'ch', terminate & step over.

						if (ch == '>')
						{
							// end of tag
						}
						else if (PUGI_IMPL_IS_CHARTYPE(ch, ct_space))
						{
						LOC_ATTRIBUTES:
							while (true)
							{
								PUGI_IMPL_SKIPWS(); // Eat any whitespace.

								if (PUGI_IMPL_IS_CHARTYPE(*s, ct_start_symbol)) // <... #...
								{
									xml_attribute_struct* a = append_new_attribute(cursor, *alloc); // Make space for this attribute.
									if (!a) PUGI_IMPL_THROW_ERROR(status_out_of_memory, s);

									a->name = s; // Save the offset.

									PUGI_IMPL_SCANWHILE_UNROLL(PUGI_IMPL_IS_CHARTYPE(ss, ct_symbol)); // Scan for a terminator.
									PUGI_IMPL_ENDSEG(); // Save char in 'ch', terminate & step over.

									if (PUGI_IMPL_IS_CHARTYPE(ch, ct_space))
									{
										PUGI_IMPL_SKIPWS(); // Eat any whitespace.

										ch = *s;
										++s;
									}

									if (ch == '=') // '<... #=...'
									{
										PUGI_IMPL_SKIPWS(); // Eat any whitespace.

										if (*s == '"' || *s == '\'') // '<... #="...'
										{
											ch = *s; // Save quote char to avoid breaking on "''" -or- '""'.
											++s; // Step over the quote.
											a->value = s; // Save the offset.

											s = strconv_attribute(s, ch);

											if (!s) PUGI_IMPL_THROW_ERROR(status_bad_attribute, a->value);

											// After this line the loop continues from the start;
											// Whitespaces, / and > are ok, symbols and EOF are wrong,
											// everything else will be detected
											if (PUGI_IMPL_IS_CHARTYPE(*s, ct_start_symbol)) PUGI_IMPL_THROW_ERROR(status_bad_attribute, s);
										}
										else PUGI_IMPL_THROW_ERROR(status_bad_attribute, s);
									}
									else PUGI_IMPL_THROW_ERROR(status_bad_attribute, s);
								}
								else if (*s == '/')
								{
									++s;

									if (*s == '>')
									{
										PUGI_IMPL_POPNODE();
										s++;
										break;
									}
									else if (*s == 0 && endch == '>')
									{
										PUGI_IMPL_POPNODE();
										break;
									}
									else PUGI_IMPL_THROW_ERROR(status_bad_start_element, s);
								}
								else if (*s == '>')
								{
									++s;

									break;
								}
								else if (*s == 0 && endch == '>')
								{
									break;
								}
								else PUGI_IMPL_THROW_ERROR(status_bad_start_element, s);
							}

							// !!!
						}
						else if (ch == '/') // '<#.../'
						{
							if (!PUGI_IMPL_ENDSWITH(*s, '>')) PUGI_IMPL_THROW_ERROR(status_bad_start_element, s);

							PUGI_IMPL_POPNODE(); // Pop.

							s += (*s == '>');
						}
						else if (ch == 0)
						{
							// we stepped over null terminator, backtrack & handle closing tag
							--s;

							if (endch != '>') PUGI_IMPL_THROW_ERROR(status_bad_start_element, s);
						}
						else PUGI_IMPL_THROW_ERROR(status_bad_start_element, s);
					}
					else if (*s == '/')
					{
						++s;

						mark = s;

						char_t* name = cursor->name;
						if (!name) PUGI_IMPL_THROW_ERROR(status_end_element_mismatch, mark);

						while (PUGI_IMPL_IS_CHARTYPE(*s, ct_symbol))
						{
							if (*s++ != *name++) PUGI_IMPL_THROW_ERROR(status_end_element_mismatch, mark);
						}

						if (*name)
						{
							if (*s == 0 && name[0] == endch && name[1] == 0) PUGI_IMPL_THROW_ERROR(status_bad_end_element, s);
							else PUGI_IMPL_THROW_ERROR(status_end_element_mismatch, mark);
						}

						PUGI_IMPL_POPNODE(); // Pop.

						PUGI_IMPL_SKIPWS();

						if (*s == 0)
						{
							if (endch != '>') PUGI_IMPL_THROW_ERROR(status_bad_end_element, s);
						}
						else
						{
							if (*s != '>') PUGI_IMPL_THROW_ERROR(status_bad_end_element, s);
							++s;
						}
					}
					else if (*s == '?') // '<?...'
					{
						s = parse_question(s, cursor, optmsk, endch);
						if (!s) return s;

						assert(cursor);
						if (PUGI_IMPL_NODETYPE(cursor) == node_declaration) goto LOC_ATTRIBUTES;
					}
					else if (*s == '!') // '<!...'
					{
						s = parse_exclamation(s, cursor, optmsk, endch);
						if (!s) return s;
					}
					else if (*s == 0 && endch == '?') PUGI_IMPL_THROW_ERROR(status_bad_pi, s);
					else PUGI_IMPL_THROW_ERROR(status_unrecognized_tag, s);
				}
				else
				{
					mark = s; // Save this offset while searching for a terminator.

					PUGI_IMPL_SKIPWS(); // Eat whitespace if no genuine PCDATA here.

					if (*s == '<' || !*s)
					{
						// We skipped some whitespace characters because otherwise we would take the tag branch instead of PCDATA one
						assert(mark != s);

						if (!PUGI_IMPL_OPTSET(parse_ws_pcdata | parse_ws_pcdata_single) || PUGI_IMPL_OPTSET(parse_trim_pcdata))
						{
							continue;
						}
						else if (PUGI_IMPL_OPTSET(parse_ws_pcdata_single))
						{
							if (s[0] != '<' || s[1] != '/' || cursor->first_child) continue;
						}
					}

					if (!PUGI_IMPL_OPTSET(parse_trim_pcdata))
						s = mark;

					if (cursor->parent || PUGI_IMPL_OPTSET(parse_fragment))
					{
						if (PUGI_IMPL_OPTSET(parse_embed_pcdata) && cursor->parent && !cursor->first_child && !cursor->value)
						{
							cursor->value = s; // Save the offset.
						}
						else
						{
							PUGI_IMPL_PUSHNODE(node_pcdata); // Append a new node on the tree.

							cursor->value = s; // Save the offset.

							PUGI_IMPL_POPNODE(); // Pop since this is a standalone.
						}

						s = strconv_pcdata(s);

						if (!*s) break;
					}
					else
					{
						PUGI_IMPL_SCANFOR(*s == '<'); // '...<'
						if (!*s) break;

						++s;
					}

					// We're after '<'
					goto LOC_TAG;
				}
			}

			// check that last tag is closed
			if (cursor != root) PUGI_IMPL_THROW_ERROR(status_end_element_mismatch, s);

			return s;
		}